

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O3

OPJ_INT32 opj_mqc_decode(opj_mqc_t *mqc)

{
  OPJ_BYTE *pOVar1;
  byte bVar2;
  uint uVar3;
  OPJ_UINT32 OVar4;
  opj_mqc_state_t **ppoVar5;
  opj_mqc_state_t *poVar6;
  OPJ_BYTE *pOVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  OPJ_UINT32 OVar11;
  OPJ_UINT32 OVar12;
  uint uVar13;
  int iVar14;
  
  ppoVar5 = mqc->curctx;
  poVar6 = *ppoVar5;
  uVar3 = poVar6->qeval;
  uVar8 = mqc->c;
  uVar9 = mqc->a - uVar3;
  mqc->a = uVar9;
  if (uVar8 >> 0x10 < uVar3) {
    OVar4 = poVar6->mps;
    mqc->a = uVar3;
    *ppoVar5 = (&poVar6->nmps)[uVar3 <= uVar9];
    OVar11 = mqc->ct;
    uVar10 = uVar3;
    do {
      if (OVar11 == 0) {
        pOVar7 = mqc->bp;
        OVar11 = 8;
        iVar14 = 0xff00;
        if (pOVar7 != mqc->end) {
          pOVar1 = pOVar7 + 1;
          if (pOVar1 == mqc->end) {
            uVar13 = 0xff;
            if (*pOVar7 != 0xff) goto LAB_0011c843;
          }
          else {
            bVar2 = pOVar7[1];
            uVar13 = (uint)bVar2;
            if (*pOVar7 == 0xff) {
              if (bVar2 < 0x90) {
                mqc->bp = pOVar1;
                iVar14 = (uint)bVar2 << 9;
                OVar11 = 7;
              }
            }
            else {
LAB_0011c843:
              mqc->bp = pOVar1;
              iVar14 = uVar13 << 8;
            }
          }
        }
        uVar8 = uVar8 + iVar14;
      }
      uVar10 = uVar10 * 2;
      mqc->a = uVar10;
      uVar8 = uVar8 * 2;
      mqc->c = uVar8;
      OVar11 = OVar11 - 1;
      mqc->ct = OVar11;
    } while (uVar10 < 0x8000);
    OVar11 = 1 - OVar4;
    if (uVar9 < uVar3) {
      OVar11 = OVar4;
    }
  }
  else {
    OVar11 = uVar8 + uVar3 * -0x10000;
    mqc->c = OVar11;
    if ((short)uVar9 < 0) {
      OVar11 = poVar6->mps;
    }
    else {
      OVar4 = poVar6->mps;
      *ppoVar5 = (&poVar6->nmps)[uVar9 < uVar3];
      OVar12 = mqc->ct;
      uVar8 = uVar9;
      do {
        if (OVar12 == 0) {
          pOVar7 = mqc->bp;
          OVar12 = 8;
          iVar14 = 0xff00;
          if (pOVar7 != mqc->end) {
            pOVar1 = pOVar7 + 1;
            if (pOVar1 == mqc->end) {
              uVar10 = 0xff;
              if (*pOVar7 != 0xff) goto LAB_0011c8ff;
            }
            else {
              bVar2 = pOVar7[1];
              uVar10 = (uint)bVar2;
              if (*pOVar7 == 0xff) {
                if (bVar2 < 0x90) {
                  mqc->bp = pOVar1;
                  iVar14 = (uint)bVar2 << 9;
                  OVar12 = 7;
                }
              }
              else {
LAB_0011c8ff:
                mqc->bp = pOVar1;
                iVar14 = uVar10 << 8;
              }
            }
          }
          OVar11 = OVar11 + iVar14;
        }
        uVar8 = uVar8 * 2;
        mqc->a = uVar8;
        OVar11 = OVar11 * 2;
        mqc->c = OVar11;
        OVar12 = OVar12 - 1;
        mqc->ct = OVar12;
      } while (uVar8 < 0x8000);
      OVar11 = 1 - OVar4;
      if (uVar3 <= uVar9) {
        OVar11 = OVar4;
      }
    }
  }
  return OVar11;
}

Assistant:

OPJ_INT32 opj_mqc_decode(opj_mqc_t *const mqc) {
	OPJ_INT32 d;
	mqc->a -= (*mqc->curctx)->qeval;
	if ((mqc->c >> 16) < (*mqc->curctx)->qeval) {
		d = opj_mqc_lpsexchange(mqc);
		opj_mqc_renormd(mqc);
	} else {
		mqc->c -= (*mqc->curctx)->qeval << 16;
		if ((mqc->a & 0x8000) == 0) {
			d = opj_mqc_mpsexchange(mqc);
			opj_mqc_renormd(mqc);
		} else {
			d = (OPJ_INT32)(*mqc->curctx)->mps;
		}
	}

	return d;
}